

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableManager.cpp
# Opt level: O2

void __thiscall rsg::VariableManager::popValueScope(VariableManager *this)

{
  pointer ppVVar1;
  mapped_type pVVar2;
  ConstValueRangeAccess value;
  ConstValueRangeAccess value_00;
  VariableManager *this_00;
  mapped_type *ppVVar3;
  iterator iVar4;
  iterator iVar5;
  ValueEntry *pVVar6;
  pointer ppVVar7;
  ValueScope *pVVar8;
  pointer ppVVar9;
  Variable *var;
  ValueEntry *entry;
  set<const_rsg::Variable_*,_std::less<const_rsg::Variable_*>,_std::allocator<const_rsg::Variable_*>_>
  addedVars;
  map<const_rsg::Variable_*,_const_rsg::ValueEntry_*,_std::less<const_rsg::Variable_*>,_std::allocator<std::pair<const_rsg::Variable_*const,_const_rsg::ValueEntry_*>_>_>
  oldValues;
  ValueRange intersectedValue;
  Variable *local_1b0;
  ValueScope *local_1a8;
  VariableManager *local_1a0;
  vector<rsg::ValueEntry_const*,std::allocator<rsg::ValueEntry_const*>> *local_198;
  ValueEntry *local_190;
  pointer local_188;
  ValueScope *local_180;
  ValueScope *local_178;
  ValueRange *local_170;
  Scalar *pSStack_168;
  Scalar *local_160;
  Variable **local_158;
  pointer pSStack_150;
  Scalar *local_148;
  ConstValueRangeAccess local_140;
  ConstValueRangeAccess local_128;
  _Rb_tree<const_rsg::Variable_*,_const_rsg::Variable_*,_std::_Identity<const_rsg::Variable_*>,_std::less<const_rsg::Variable_*>,_std::allocator<const_rsg::Variable_*>_>
  local_110;
  _Rb_tree<const_rsg::Variable_*,_std::pair<const_rsg::Variable_*const,_const_rsg::ValueEntry_*>,_std::_Select1st<std::pair<const_rsg::Variable_*const,_const_rsg::ValueEntry_*>_>,_std::less<const_rsg::Variable_*>,_std::allocator<std::pair<const_rsg::Variable_*const,_const_rsg::ValueEntry_*>_>_>
  local_e0;
  ValueRange local_b0;
  
  ppVVar7 = (this->m_valueScopeStack).
            super__Vector_base<rsg::ValueScope_*,_std::allocator<rsg::ValueScope_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppVVar1 = (this->m_entryCache).
            super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pVVar8 = ppVVar7[-1];
  (this->m_valueScopeStack).
  super__Vector_base<rsg::ValueScope_*,_std::allocator<rsg::ValueScope_*>_>._M_impl.
  super__Vector_impl_data._M_finish = ppVVar7 + -1;
  if ((this->m_entryCache).
      super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppVVar1) {
    (this->m_entryCache).
    super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppVVar1;
  }
  if ((this->m_valueScopeStack).
      super__Vector_base<rsg::ValueScope_*,_std::allocator<rsg::ValueScope_*>_>._M_impl.
      super__Vector_impl_data._M_start != ppVVar7 + -1) {
    local_180 = ppVVar7[-2];
    local_e0._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_e0._M_impl.super__Rb_tree_header._M_header;
    local_e0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_e0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_e0._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_198 = (vector<rsg::ValueEntry_const*,std::allocator<rsg::ValueEntry_const*>> *)
                &this->m_entryCache;
    local_e0._M_impl.super__Rb_tree_header._M_header._M_right =
         local_e0._M_impl.super__Rb_tree_header._M_header._M_left;
    for (ppVVar9 = (pVVar8->m_entries).
                   super__Vector_base<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_>._M_impl
                   .super__Vector_impl_data._M_start;
        ppVVar9 !=
        (pVVar8->m_entries).
        super__Vector_base<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppVVar9 = ppVVar9 + 1) {
      pVVar2 = *ppVVar9;
      local_b0.m_type._0_8_ = pVVar2->m_variable;
      ppVVar3 = std::
                map<const_rsg::Variable_*,_const_rsg::ValueEntry_*,_std::less<const_rsg::Variable_*>,_std::allocator<std::pair<const_rsg::Variable_*const,_const_rsg::ValueEntry_*>_>_>
                ::operator[]((map<const_rsg::Variable_*,_const_rsg::ValueEntry_*,_std::less<const_rsg::Variable_*>,_std::allocator<std::pair<const_rsg::Variable_*const,_const_rsg::ValueEntry_*>_>_>
                              *)&local_e0,(key_type *)&local_b0);
      *ppVVar3 = pVVar2;
    }
    local_110._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_110._M_impl.super__Rb_tree_header._M_header;
    local_110._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_110._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_110._M_impl.super__Rb_tree_header._M_node_count = 0;
    ppVVar7 = (this->m_valueScopeStack).
              super__Vector_base<rsg::ValueScope_*,_std::allocator<rsg::ValueScope_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    local_1a8 = pVVar8;
    local_1a0 = this;
    local_110._M_impl.super__Rb_tree_header._M_header._M_right =
         local_110._M_impl.super__Rb_tree_header._M_header._M_left;
    while (this_00 = local_1a0,
          ppVVar7 !=
          (local_1a0->m_valueScopeStack).
          super__Vector_base<rsg::ValueScope_*,_std::allocator<rsg::ValueScope_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
      pVVar8 = ppVVar7[-1];
      local_188 = ppVVar7 + -1;
      local_178 = pVVar8;
      for (ppVVar9 = (pVVar8->m_entries).
                     super__Vector_base<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_>.
                     _M_impl.super__Vector_impl_data._M_start; ppVVar7 = local_188,
          ppVVar9 !=
          (pVVar8->m_entries).
          super__Vector_base<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_>._M_impl.
          super__Vector_impl_data._M_finish; ppVVar9 = ppVVar9 + 1) {
        local_190 = *ppVVar9;
        local_1b0 = local_190->m_variable;
        iVar4 = std::
                _Rb_tree<const_rsg::Variable_*,_const_rsg::Variable_*,_std::_Identity<const_rsg::Variable_*>,_std::less<const_rsg::Variable_*>,_std::allocator<const_rsg::Variable_*>_>
                ::find(&local_110,&local_1b0);
        if ((_Rb_tree_header *)iVar4._M_node == &local_110._M_impl.super__Rb_tree_header) {
          iVar5 = std::
                  _Rb_tree<const_rsg::Variable_*,_std::pair<const_rsg::Variable_*const,_const_rsg::ValueEntry_*>,_std::_Select1st<std::pair<const_rsg::Variable_*const,_const_rsg::ValueEntry_*>_>,_std::less<const_rsg::Variable_*>,_std::allocator<std::pair<const_rsg::Variable_*const,_const_rsg::ValueEntry_*>_>_>
                  ::find(&local_e0,&local_1b0);
          if ((_Rb_tree_header *)iVar5._M_node == &local_e0._M_impl.super__Rb_tree_header) {
            std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>::
            push_back((vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_> *)
                      local_198,&local_190);
          }
          else {
            ppVVar3 = std::
                      map<const_rsg::Variable_*,_const_rsg::ValueEntry_*,_std::less<const_rsg::Variable_*>,_std::allocator<std::pair<const_rsg::Variable_*const,_const_rsg::ValueEntry_*>_>_>
                      ::operator[]((map<const_rsg::Variable_*,_const_rsg::ValueEntry_*,_std::less<const_rsg::Variable_*>,_std::allocator<std::pair<const_rsg::Variable_*const,_const_rsg::ValueEntry_*>_>_>
                                    *)&local_e0,&local_1b0);
            pVVar2 = *ppVVar3;
            ValueRange::ValueRange(&local_b0,&local_1b0->m_type);
            local_140.m_min =
                 (local_190->m_valueRange).m_min.
                 super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_140.m_max =
                 (local_190->m_valueRange).m_max.
                 super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                 super__Vector_impl_data._M_start;
            if (local_140.m_min ==
                (local_190->m_valueRange).m_min.
                super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              local_140.m_min = (pointer)0x0;
            }
            local_140.m_type = &(local_190->m_valueRange).m_type;
            if (local_140.m_max ==
                (local_190->m_valueRange).m_max.
                super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              local_140.m_max = (pointer)0x0;
            }
            local_128.m_min =
                 (pVVar2->m_valueRange).m_min.
                 super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_128.m_max =
                 (pVVar2->m_valueRange).m_max.
                 super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                 super__Vector_impl_data._M_start;
            if (local_128.m_min ==
                (pVVar2->m_valueRange).m_min.
                super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              local_128.m_min = (pointer)0x0;
            }
            if (local_128.m_max ==
                (pVVar2->m_valueRange).m_max.
                super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              local_128.m_max = (pointer)0x0;
            }
            local_128.m_type = &(pVVar2->m_valueRange).m_type;
            ValueRange::computeIntersection(&local_b0,&local_140,&local_128);
            pVVar8 = local_180;
            pVVar6 = ValueScope::findEntry(local_180,local_1b0);
            if (pVVar6 == (ValueEntry *)0x0) {
              ValueScope::allocate(pVVar8,local_1b0);
            }
            pSStack_150 = local_b0.m_min.
                          super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                          super__Vector_impl_data._M_start;
            if (local_b0.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl
                .super__Vector_impl_data._M_start ==
                local_b0.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl
                .super__Vector_impl_data._M_finish) {
              pSStack_150 = (pointer)0x0;
            }
            local_148 = local_b0.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            if (local_b0.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl
                .super__Vector_impl_data._M_start ==
                local_b0.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl
                .super__Vector_impl_data._M_finish) {
              local_148 = (Scalar *)0x0;
            }
            local_158 = (Variable **)&local_b0;
            value.m_min = pSStack_150;
            value.m_type = (VariableType *)local_158;
            value.m_max = local_148;
            ValueScope::setValue(pVVar8,local_1b0,value);
            local_140.m_type = (VariableType *)ValueScope::findEntry(pVVar8,local_1b0);
            std::vector<rsg::ValueEntry_const*,std::allocator<rsg::ValueEntry_const*>>::
            emplace_back<rsg::ValueEntry_const*>(local_198,(ValueEntry **)&local_140);
            ValueRange::~ValueRange(&local_b0);
            pVVar8 = local_178;
          }
          std::
          _Rb_tree<rsg::Variable_const*,rsg::Variable_const*,std::_Identity<rsg::Variable_const*>,std::less<rsg::Variable_const*>,std::allocator<rsg::Variable_const*>>
          ::_M_insert_unique<rsg::Variable_const*const&>
                    ((_Rb_tree<rsg::Variable_const*,rsg::Variable_const*,std::_Identity<rsg::Variable_const*>,std::less<rsg::Variable_const*>,std::allocator<rsg::Variable_const*>>
                      *)&local_110,&local_1b0);
        }
      }
    }
    for (ppVVar9 = (local_1a8->m_entries).
                   super__Vector_base<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_>._M_impl
                   .super__Vector_impl_data._M_start;
        ppVVar9 !=
        (local_1a8->m_entries).
        super__Vector_base<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppVVar9 = ppVVar9 + 1) {
      pVVar6 = *ppVVar9;
      local_b0.m_type._0_8_ = pVVar6->m_variable;
      iVar4 = std::
              _Rb_tree<const_rsg::Variable_*,_const_rsg::Variable_*,_std::_Identity<const_rsg::Variable_*>,_std::less<const_rsg::Variable_*>,_std::allocator<const_rsg::Variable_*>_>
              ::find(&local_110,(key_type *)&local_b0);
      if ((_Rb_tree_header *)iVar4._M_node == &local_110._M_impl.super__Rb_tree_header) {
        pSStack_168 = (pVVar6->m_valueRange).m_min.
                      super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                      super__Vector_impl_data._M_start;
        local_160 = (pVVar6->m_valueRange).m_max.
                    super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                    super__Vector_impl_data._M_start;
        if (pSStack_168 ==
            (pVVar6->m_valueRange).m_min.
            super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          pSStack_168 = (Scalar *)0x0;
        }
        if (local_160 ==
            (pVVar6->m_valueRange).m_max.
            super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          local_160 = (Scalar *)0x0;
        }
        local_170 = &pVVar6->m_valueRange;
        value_00.m_min = pSStack_168;
        value_00.m_type = &local_170->m_type;
        value_00.m_max = local_160;
        setValue(this_00,(Variable *)local_b0.m_type._0_8_,value_00);
      }
    }
    std::
    _Rb_tree<const_rsg::Variable_*,_const_rsg::Variable_*,_std::_Identity<const_rsg::Variable_*>,_std::less<const_rsg::Variable_*>,_std::allocator<const_rsg::Variable_*>_>
    ::~_Rb_tree(&local_110);
    std::
    _Rb_tree<const_rsg::Variable_*,_std::pair<const_rsg::Variable_*const,_const_rsg::ValueEntry_*>,_std::_Select1st<std::pair<const_rsg::Variable_*const,_const_rsg::ValueEntry_*>_>,_std::less<const_rsg::Variable_*>,_std::allocator<std::pair<const_rsg::Variable_*const,_const_rsg::ValueEntry_*>_>_>
    ::~_Rb_tree(&local_e0);
  }
  return;
}

Assistant:

void VariableManager::popValueScope (void)
{
	ValueScope& oldScope = getCurValueScope();

	// Pop scope and clear cache.
	m_valueScopeStack.pop_back();
	m_entryCache.clear();

	// Re-build entry cache.
	if (!m_valueScopeStack.empty())
	{
		ValueScope& newTopScope = getCurValueScope();

		// Speed up computing intersections.
		map<const Variable*, const ValueEntry*>	oldValues;
		const vector<ValueEntry*>&				oldEntries = oldScope.getValues();

		for (vector<ValueEntry*>::const_iterator valueIter = oldEntries.begin(); valueIter != oldEntries.end(); valueIter++)
			oldValues[(*valueIter)->getVariable()] = *valueIter;

		set<const Variable*> addedVars;

		// Re-build based on current stack.
		for (vector<ValueScope*>::reverse_iterator scopeIter = m_valueScopeStack.rbegin(); scopeIter != m_valueScopeStack.rend(); scopeIter++)
		{
			const ValueScope*			scope			= *scopeIter;
			const vector<ValueEntry*>&	valueEntries	= scope->getValues();

			for (vector<ValueEntry*>::const_iterator valueIter = valueEntries.begin(); valueIter != valueEntries.end(); valueIter++)
			{
				const ValueEntry*	entry	= *valueIter;
				const Variable*		var		= entry->getVariable();

				if (addedVars.find(var) != addedVars.end())
					continue; // Already in cache, set deeper in scope stack.

				DE_ASSERT(std::find(m_entryCache.begin(), m_entryCache.end(), CompareEntryVariable(var)) == m_entryCache.end());

				if (oldValues.find(var) != oldValues.end())
				{
					const ValueEntry* oldEntry = oldValues[var];

					// Build new intersected value and store into current scope.
					ValueRange intersectedValue(var->getType());
					DE_ASSERT(oldEntry->getValueRange().intersects(entry->getValueRange())); // Must intersect
					ValueRange::computeIntersection(intersectedValue, entry->getValueRange(), oldEntry->getValueRange());

					if (!newTopScope.findEntry(var))
						newTopScope.allocate(var);

					newTopScope.setValue(var, intersectedValue.asAccess());

					// Add entry from top scope to cache.
					m_entryCache.push_back(newTopScope.findEntry(var));
				}
				else
					m_entryCache.push_back(entry); // Just add to cache.

				addedVars.insert(var); // Record as cached variable.
			}
		}

		// Copy entries from popped scope that don't yet exist in the stack.
		for (vector<ValueEntry*>::const_iterator valueIter = oldEntries.begin(); valueIter != oldEntries.end(); valueIter++)
		{
			const ValueEntry*	oldEntry	= *valueIter;
			const Variable*		var			= oldEntry->getVariable();

			if (addedVars.find(var) == addedVars.end())
				setValue(var, oldEntry->getValueRange());
		}
	}
}